

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,read_wm_data>
          (xr_reader *this,vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *n,
          vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *container)

{
  vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *this_00;
  reference wm;
  undefined1 local_58 [16];
  pointer local_48;
  pointer pwStack_40;
  pointer local_38;
  vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *local_28;
  vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *container_local;
  size_t n_local;
  xr_reader *this_local;
  
  local_28 = container;
  container_local = n;
  n_local = (size_t)this;
  std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::reserve(container,(size_type)n);
  while (this_00 = local_28,
        container_local != (vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *)0x0) {
    local_48 = (pointer)0x0;
    pwStack_40 = (pointer)0x0;
    local_58._0_8_ = 0;
    local_58._8_8_ = 0;
    local_38 = (pointer)0x0;
    container_local =
         (vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *)
         ((long)&container_local[-1].
                 super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
    wm_data::wm_data((wm_data *)local_58);
    std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::push_back
              (this_00,(wm_data *)local_58);
    wm_data::~wm_data((wm_data *)local_58);
    wm = std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::back(local_28);
    read_wm_data::operator()((read_wm_data *)((long)&this_local + 7),wm,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}